

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result wabt::interp::Match(TableType *expected,TableType *actual,string *out_msg)

{
  Result RVar1;
  Enum EVar2;
  ValueType in_stack_ffffffffffffff78;
  undefined8 local_68;
  string local_48;
  
  if (*(int *)&(expected->super_ExternType).field_0xc ==
      *(int *)&(actual->super_ExternType).field_0xc) {
    RVar1 = Match(&expected->limits,&actual->limits,out_msg);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  else {
    GetName_abi_cxx11_(in_stack_ffffffffffffff78);
    GetName_abi_cxx11_(in_stack_ffffffffffffff78);
    StringPrintf_abi_cxx11_
              (&local_48,"type mismatch in imported table, expected %s but got %s.",local_68,
               in_stack_ffffffffffffff78);
    std::__cxx11::string::operator=((string *)out_msg,(string *)&local_48);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    EVar2 = Error;
  }
  return (Result)EVar2;
}

Assistant:

Result Match(const TableType& expected,
             const TableType& actual,
             std::string* out_msg) {
  if (expected.element != actual.element) {
    *out_msg = StringPrintf(
        "type mismatch in imported table, expected %s but got %s.",
        GetName(expected.element).c_str(), GetName(actual.element).c_str());
    return Result::Error;
  }

  if (Failed(Match(expected.limits, actual.limits, out_msg))) {
    return Result::Error;
  }

  return Result::Ok;
}